

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O3

int run_test_pipe_listen_without_bind(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_pipe_t server;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,(uv_pipe_t *)&stack0xfffffffffffffef0,0);
  if (iVar1 == 0) {
    puVar2 = (uv_loop_t *)&stack0xfffffffffffffef0;
    iVar1 = uv_listen((uv_stream_t *)puVar2,0x1000,(uv_connection_cb)0x0);
    if (iVar1 != -0x16) goto LAB_0016e7a1;
    uv_close((uv_handle_t *)&stack0xfffffffffffffef0,close_cb);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (close_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0016e7ab;
    }
  }
  else {
    run_test_pipe_listen_without_bind_cold_1();
LAB_0016e7a1:
    run_test_pipe_listen_without_bind_cold_2();
  }
  run_test_pipe_listen_without_bind_cold_3();
LAB_0016e7ab:
  run_test_pipe_listen_without_bind_cold_4();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(pipe_listen_without_bind) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  uv_pipe_t server;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server, 0);
  ASSERT(r == 0);

  r = uv_listen((uv_stream_t*)&server, SOMAXCONN, NULL);
  ASSERT(r == UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}